

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  ZSTD_CCtx_params *in_RDI;
  undefined1 auVar2 [12];
  undefined1 auVar3 [24];
  undefined1 auVar4 [32];
  undefined1 auVar5 [28];
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 uStack000000000000001c;
  undefined4 uStack0000000000000020;
  
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])&(in_RDI->ldmParams).hashRateLog = auVar4;
  auVar3 = auVar4._0_24_;
  (in_RDI->ldmParams).enableLdm = auVar3._0_4_;
  (in_RDI->ldmParams).hashLog = auVar3._4_4_;
  (in_RDI->ldmParams).bucketSizeLog = auVar3._8_4_;
  (in_RDI->ldmParams).minMatchLength = auVar3._12_4_;
  (in_RDI->ldmParams).hashRateLog = auVar3._16_4_;
  (in_RDI->ldmParams).windowLog = auVar3._20_4_;
  (in_RDI->customMem).customAlloc = (ZSTD_allocFunction)auVar4._24_8_;
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  in_RDI->srcSizeHint = auVar4._0_4_;
  in_RDI->attachDictPref = auVar4._4_4_;
  in_RDI->literalCompressionMode = auVar4._8_4_;
  in_RDI->nbWorkers = auVar4._12_4_;
  in_RDI->jobSize = auVar4._16_8_;
  in_RDI->overlapLog = auVar4._24_4_;
  in_RDI->rsyncable = auVar4._28_4_;
  auVar2 = auVar4._0_12_;
  (in_RDI->fParams).contentSizeFlag = auVar2._0_4_;
  (in_RDI->fParams).checksumFlag = auVar2._4_4_;
  (in_RDI->fParams).noDictIDFlag = auVar2._8_4_;
  in_RDI->compressionLevel = auVar4._12_4_;
  in_RDI->forceWindow = auVar4._16_4_;
  *(int *)&in_RDI->field_0x34 = auVar4._20_4_;
  in_RDI->targetCBlockSize = auVar4._24_8_;
  auVar5 = auVar4._4_28_;
  in_RDI->format = auVar4._0_4_;
  (in_RDI->cParams).windowLog = auVar5._0_4_;
  (in_RDI->cParams).chainLog = auVar5._4_4_;
  (in_RDI->cParams).hashLog = auVar5._8_4_;
  (in_RDI->cParams).searchLog = auVar5._12_4_;
  (in_RDI->cParams).minMatch = auVar5._16_4_;
  (in_RDI->cParams).targetLength = auVar5._20_4_;
  (in_RDI->cParams).strategy = auVar5._24_4_;
  (in_RDI->cParams).windowLog = uStack0000000000000008;
  (in_RDI->cParams).chainLog = uStack000000000000000c;
  (in_RDI->cParams).hashLog = in_stack_00000010;
  (in_RDI->cParams).searchLog = in_stack_00000014;
  (in_RDI->cParams).searchLog = in_stack_00000014;
  (in_RDI->cParams).minMatch = in_stack_00000018;
  (in_RDI->cParams).targetLength = uStack000000000000001c;
  (in_RDI->cParams).strategy = uStack0000000000000020;
  in_RDI->compressionLevel = 3;
  cParams_00.hashLog = in_stack_00000010;
  cParams_00._0_8_ = _uStack0000000000000008;
  cParams_00.searchLog = in_stack_00000014;
  cParams_00.minMatch = in_stack_00000018;
  cParams_00._20_8_ = _uStack000000000000001c;
  sVar1 = ZSTD_checkCParams(cParams_00);
  if (sVar1 == 0) {
    (in_RDI->fParams).contentSizeFlag = 1;
    return in_RDI;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2b0f,
                "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    memset(&cctxParams, 0, sizeof(cctxParams));
    cctxParams.cParams = cParams;
    cctxParams.compressionLevel = ZSTD_CLEVEL_DEFAULT;  /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(cParams));
    cctxParams.fParams.contentSizeFlag = 1;
    return cctxParams;
}